

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.cpp
# Opt level: O1

StatisticObject __thiscall
Clasp::ClaspStatistics::findObject(ClaspStatistics *this,Key_t root,char *path,Key_t *res)

{
  Key_t *pKVar1;
  bool bVar2;
  reference ppIVar3;
  char *pcVar4;
  E EVar5;
  ulong __n;
  pair<std::__detail::_Node_iterator<unsigned_long,_true,_false>,_bool> pVar6;
  char *top;
  StatisticObject local_468;
  char *local_460;
  int pos;
  ClaspStatistics *local_450;
  Key_t *local_448;
  uint64 local_440;
  char temp [1024];
  
  local_450 = this;
  local_448 = res;
  local_468 = Impl::get(this->impl_,root);
  if (local_468.handle_ == 0) {
    EVar5 = Empty;
  }
  else {
    ppIVar3 = bk_lib::
              pod_vector<const_Clasp::StatisticObject::I_*,_std::allocator<const_Clasp::StatisticObject::I_*>_>
              ::at((pod_vector<const_Clasp::StatisticObject::I_*,_std::allocator<const_Clasp::StatisticObject::I_*>_>
                    *)StatisticObject::types_s,(uint)(ushort)(local_468.handle_ >> 0x30));
    EVar5 = ((*ppIVar3)->type).val_;
  }
  local_460 = path;
  if (path != (char *)0x0) {
    do {
      if (*path == '\0') break;
      top = path;
      pcVar4 = strchr(path,0x2e);
      if (pcVar4 == (char *)0x0) {
        pcVar4 = (char *)0x0;
      }
      else {
        __n = (long)pcVar4 - (long)path;
        if (0x3ff < __n) {
          Potassco::fail(-1,
                         "StatisticObject Clasp::ClaspStatistics::findObject(Key_t, const char *, Key_t *) const"
                         ,0x15c,"len < 1024","invalid key",0);
        }
        pcVar4 = pcVar4 + 1;
        memcpy(temp,path,__n);
        temp[__n] = '\0';
        top = temp;
      }
      if (EVar5 == Array) {
        bVar2 = Potassco::match(&top,&pos);
        if ((!bVar2) || (pos < 0)) goto LAB_00175404;
        local_468 = StatisticObject::operator[](&local_468,pos);
      }
      else {
        if (EVar5 != Map) {
LAB_00175404:
          Potassco::fail(0x22,
                         "StatisticObject Clasp::ClaspStatistics::findObject(Key_t, const char *, Key_t *) const"
                         ,0x165,"false","invalid path: \'%s\' at key \'%s\'",local_460,top,0);
        }
        local_468 = StatisticObject::at(&local_468,top);
      }
      if (local_468.handle_ == 0) {
        EVar5 = Empty;
      }
      else {
        ppIVar3 = bk_lib::
                  pod_vector<const_Clasp::StatisticObject::I_*,_std::allocator<const_Clasp::StatisticObject::I_*>_>
                  ::at((pod_vector<const_Clasp::StatisticObject::I_*,_std::allocator<const_Clasp::StatisticObject::I_*>_>
                        *)StatisticObject::types_s,(uint)(ushort)(local_468.handle_ >> 0x30));
        EVar5 = ((*ppIVar3)->type).val_;
      }
      path = pcVar4;
    } while (pcVar4 != (char *)0x0);
  }
  pKVar1 = local_448;
  if (local_448 != (Key_t *)0x0) {
    _pos = local_450->impl_;
    local_440 = local_468.handle_;
    pVar6 = std::
            _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<unsigned_long,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                      ();
    *pKVar1 = *(Key_t *)((long)pVar6.first.super__Node_iterator_base<unsigned_long,_false>._M_cur.
                               super__Node_iterator_base<unsigned_long,_false> + 8);
  }
  return (StatisticObject)local_468.handle_;
}

Assistant:

StatisticObject ClaspStatistics::findObject(Key_t root, const char* path, Key_t* res) const {
	StatisticObject o = getObject(root);
	StatisticObject::Type t = o.type();
	char temp[1024]; const char* top, *parent = path;
	for (int pos; path && *path;) {
		top = path;
		if ((path = std::strchr(path, '.')) != 0) {
			std::size_t len = static_cast<std::size_t>(path++ - top);
			POTASSCO_ASSERT(len < 1024, "invalid key");
			top = (const char*)std::memcpy(temp, top, len);
			temp[len] = 0;
		}
		if      (t == Potassco::Statistics_t::Map) { o = o.at(top); }
		else if (t == Potassco::Statistics_t::Array && Potassco::match(top, pos) && pos >= 0) {
			o = o[uint32(pos)];
		}
		else {
			POTASSCO_CHECK(false, ERANGE, "invalid path: '%s' at key '%s'", parent, top);
		}
		t = o.type();
	}
	if (res) { *res = impl_->add(o); }
	return o;
}